

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O3

void duckdb_je_arena_dalloc_promoted(tsdn_t *tsdn,void *ptr,tcache_t *tcache,_Bool slow_path)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  ulong *puVar3;
  bin_t *bin;
  undefined8 *puVar4;
  undefined8 *puVar5;
  void *pvVar6;
  rtree_leaf_elm_t *prVar7;
  ulong uVar8;
  undefined8 uVar9;
  int iVar10;
  edata_t *peVar11;
  ulong uVar12;
  rtree_ctx_t *prVar13;
  ulong uVar14;
  emap_t *arena;
  long lVar15;
  pthread_mutex_t *ppVar16;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t rStack_348;
  void *pvStack_1c8;
  rtree_ctx_t rStack_198;
  
  prVar13 = &rStack_198;
  if (tsdn == (tsdn_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(&rStack_198);
  }
  else {
    prVar13 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  arena = &duckdb_je_arena_emap_global;
  duckdb_je_rtree_leaf_elm_lookup_hard
            (tsdn,&duckdb_je_arena_emap_global.rtree,prVar13,(uintptr_t)ptr,true,false);
  ppVar16 = (pthread_mutex_t *)((long)&(((arena_t *)arena)->large_mtx).field_0 + 0x48);
  pvStack_1c8 = ptr;
  iVar10 = pthread_mutex_trylock(ppVar16);
  if (iVar10 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&((arena_t *)arena)->large_mtx);
    (((arena_t *)arena)->large_mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(((arena_t *)arena)->large_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((((arena_t *)arena)->large_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    *(tsdn_t **)((long)&(((arena_t *)arena)->large_mtx).field_0 + 0x30) = tsdn;
    ppwVar2 = &(((arena_t *)arena)->large_mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  peVar11 = (((arena_t *)arena)->large).head.qlh_first;
  if (peVar11 != (edata_t *)0x0) {
    do {
      pvVar6 = peVar11->e_addr;
      (((arena_t *)arena)->large_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(ppVar16);
      prVar13 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
      if (tsdn == (tsdn_t *)0x0) {
        duckdb_je_rtree_ctx_data_init(&rStack_348);
        prVar13 = &rStack_348;
      }
      uVar12 = (ulong)pvVar6 & 0xffffffffc0000000;
      uVar14 = (ulong)(((uint)((ulong)pvVar6 >> 0x1e) & 0xf) << 4);
      puVar3 = (ulong *)((long)&prVar13->cache[0].leafkey + uVar14);
      uVar14 = *(ulong *)((long)&prVar13->cache[0].leafkey + uVar14);
      if (uVar14 != uVar12) {
        if (prVar13->l2_cache[0].leafkey == uVar12) {
          prVar7 = prVar13->l2_cache[0].leaf;
          prVar13->l2_cache[0].leafkey = uVar14;
          prVar13->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar3[1];
          *puVar3 = uVar12;
          puVar3[1] = (ulong)prVar7;
        }
        else {
          lVar15 = 0x118;
          do {
            if (*(ulong *)((long)prVar13->cache + lVar15 + -8) == uVar12) {
              uVar8 = *(ulong *)((long)&prVar13->cache[0].leafkey + lVar15);
              puVar4 = (undefined8 *)((long)prVar13->cache + lVar15 + -0x18);
              uVar9 = puVar4[1];
              puVar5 = (undefined8 *)((long)prVar13->cache + lVar15 + -8);
              *puVar5 = *puVar4;
              puVar5[1] = uVar9;
              *(ulong *)((long)prVar13->cache + lVar15 + -0x18) = uVar14;
              *(ulong *)((long)(prVar13->cache + -1) + lVar15) = puVar3[1];
              *puVar3 = uVar12;
              puVar3[1] = uVar8;
              goto LAB_01156bc8;
            }
            lVar15 = lVar15 + 0x10;
          } while (lVar15 != 0x188);
          duckdb_je_rtree_leaf_elm_lookup_hard
                    (tsdn,&duckdb_je_arena_emap_global.rtree,prVar13,
                     (ulong)pvVar6 & 0xfffffffffffff000,true,false);
        }
      }
LAB_01156bc8:
      duckdb_je_large_dalloc(tsdn,peVar11);
      iVar10 = pthread_mutex_trylock(ppVar16);
      if (iVar10 != 0) {
        duckdb_je_malloc_mutex_lock_slow(&((arena_t *)arena)->large_mtx);
        (((arena_t *)arena)->large_mtx).field_0.field_0.locked.repr = true;
      }
      puVar1 = &(((arena_t *)arena)->large_mtx).field_0.field_0.prof_data.n_lock_ops;
      *puVar1 = *puVar1 + 1;
      if ((((arena_t *)arena)->large_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
        *(tsdn_t **)((long)&(((arena_t *)arena)->large_mtx).field_0 + 0x30) = tsdn;
        ppwVar2 = &(((arena_t *)arena)->large_mtx).field_0.witness.link.qre_prev;
        *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
      }
      peVar11 = (((arena_t *)arena)->large).head.qlh_first;
    } while (peVar11 != (edata_t *)0x0);
  }
  (((arena_t *)arena)->large_mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(ppVar16);
  uVar14 = 0;
  do {
    if (duckdb_je_bin_infos[uVar14].n_shards != 0) {
      uVar12 = 0;
      do {
        lVar15 = uVar12 << 8;
        if (uVar14 < duckdb_je_bin_info_nbatched_sizes) {
          lVar15 = uVar12 * 0x288;
        }
        bin = (bin_t *)((long)&((arena_t *)arena)->nthreads[0].repr +
                       lVar15 + (ulong)duckdb_je_arena_bin_offsets[uVar14]);
        ppVar16 = (pthread_mutex_t *)
                  ((long)&((atomic_zu_t *)(((arena_t *)arena)->nthreads + 0x12))->repr +
                  lVar15 + (ulong)duckdb_je_arena_bin_offsets[uVar14]);
        iVar10 = pthread_mutex_trylock(ppVar16);
        if (iVar10 != 0) {
          duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)bin);
          (bin->lock).field_0.field_0.locked.repr = true;
        }
        puVar1 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
        *puVar1 = *puVar1 + 1;
        if ((bin->lock).field_0.field_0.prof_data.prev_owner != tsdn) {
          *(tsdn_t **)((long)&(bin->lock).field_0 + 0x30) = tsdn;
          ppwVar2 = &(bin->lock).field_0.witness.link.qre_prev;
          *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
        }
        if (uVar14 < duckdb_je_bin_info_nbatched_sizes) {
          batcher_init((batcher_t *)(bin + 1),0x10);
        }
        peVar11 = bin->slabcur;
        if (peVar11 != (edata_t *)0x0) {
          bin->slabcur = (edata_t *)0x0;
          (bin->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar16);
          duckdb_je_arena_slab_dalloc(tsdn,(arena_t *)arena,peVar11);
          iVar10 = pthread_mutex_trylock(ppVar16);
          if (iVar10 != 0) {
            duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)bin);
            (bin->lock).field_0.field_0.locked.repr = true;
          }
          puVar1 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar1 = *puVar1 + 1;
          if ((bin->lock).field_0.field_0.prof_data.prev_owner != tsdn) {
            *(tsdn_t **)((long)&(bin->lock).field_0 + 0x30) = tsdn;
            ppwVar2 = &(bin->lock).field_0.witness.link.qre_prev;
            *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
          }
        }
        peVar11 = duckdb_je_edata_heap_remove_first(&bin->slabs_nonfull);
        while (peVar11 != (edata_t *)0x0) {
          (bin->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar16);
          duckdb_je_arena_slab_dalloc(tsdn,(arena_t *)arena,peVar11);
          iVar10 = pthread_mutex_trylock(ppVar16);
          if (iVar10 != 0) {
            duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)bin);
            (bin->lock).field_0.field_0.locked.repr = true;
          }
          puVar1 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar1 = *puVar1 + 1;
          if ((bin->lock).field_0.field_0.prof_data.prev_owner != tsdn) {
            *(tsdn_t **)((long)&(bin->lock).field_0 + 0x30) = tsdn;
            ppwVar2 = &(bin->lock).field_0.witness.link.qre_prev;
            *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
          }
          peVar11 = duckdb_je_edata_heap_remove_first(&bin->slabs_nonfull);
        }
        peVar11 = (bin->slabs_full).head.qlh_first;
        while (peVar11 != (edata_t *)0x0) {
          arena_bin_slabs_full_remove((arena_t *)(ulong)((arena_t *)arena)->ind,bin,peVar11);
          (bin->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar16);
          duckdb_je_arena_slab_dalloc(tsdn,(arena_t *)arena,peVar11);
          iVar10 = pthread_mutex_trylock(ppVar16);
          if (iVar10 != 0) {
            duckdb_je_malloc_mutex_lock_slow((malloc_mutex_t *)bin);
            (bin->lock).field_0.field_0.locked.repr = true;
          }
          puVar1 = &(bin->lock).field_0.field_0.prof_data.n_lock_ops;
          *puVar1 = *puVar1 + 1;
          if ((bin->lock).field_0.field_0.prof_data.prev_owner != tsdn) {
            *(tsdn_t **)((long)&(bin->lock).field_0 + 0x30) = tsdn;
            ppwVar2 = &(bin->lock).field_0.witness.link.qre_prev;
            *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
          }
          peVar11 = (bin->slabs_full).head.qlh_first;
        }
        (bin->stats).curregs = 0;
        (bin->stats).curslabs = 0;
        (bin->lock).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock(ppVar16);
        uVar12 = uVar12 + 1;
      } while (uVar12 < duckdb_je_bin_infos[uVar14].n_shards);
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 != 0x24);
  duckdb_je_pa_shard_reset(tsdn,&((arena_t *)arena)->pa_shard);
  return;
}

Assistant:

void
arena_dalloc_promoted(tsdn_t *tsdn, void *ptr, tcache_t *tcache,
    bool slow_path) {
	edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	arena_dalloc_promoted_impl(tsdn, ptr, tcache, slow_path, edata);
}